

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bst.c
# Opt level: O1

void toggle(vmd_bst_t *tree,vmd_bst_rev_t *rev,vmd_bst_node_t **affected)

{
  undefined1 *puVar1;
  byte bVar2;
  undefined1 uVar3;
  vmd_bst_node_t *pvVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  vmd_bst_node_t **ppvVar8;
  size_t sVar9;
  long lVar10;
  
  if (0 < rev->erased_count) {
    lVar10 = 0;
    do {
      pvVar4 = rev->erased[lVar10];
      if (pvVar4->child[0] == pvVar4) {
        tree->free = (vmd_bst_node_t *)0x0;
      }
      else {
        if (tree->free == pvVar4) {
          tree->free = pvVar4->child[0];
        }
        pvVar4->child[1]->child[0] = pvVar4->child[0];
        pvVar4->child[0]->child[1] = pvVar4->child[1];
      }
      memcpy(&rev->erased[lVar10]->field_0x21,
             (void *)(tree->csize * lVar10 + (long)rev->erased_data),tree->csize);
      lVar10 = lVar10 + 1;
    } while (lVar10 < rev->erased_count);
  }
  if (0 < rev->erased_count) {
    lVar10 = 0;
    do {
      bVar2 = rev->erased[lVar10]->field_0x20;
      if ((bVar2 & 0x20) == 0) {
        rev->erased[lVar10]->field_0x20 = bVar2 & 0x5f;
        puVar1 = &rev->erased[lVar10]->field_0x20;
        *puVar1 = *puVar1 | 0x20;
        pvVar4 = rev->erased[lVar10];
        pvVar4->next = *affected;
        *affected = pvVar4;
      }
      insert_node(tree,rev->erased[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < rev->erased_count);
  }
  if (0 < rev->inserted_count) {
    lVar10 = 0;
    do {
      bVar2 = rev->inserted[lVar10]->field_0x20;
      if ((bVar2 & 0x20) == 0) {
        rev->inserted[lVar10]->field_0x20 = bVar2 | 0x80;
        puVar1 = &rev->inserted[lVar10]->field_0x20;
        *puVar1 = *puVar1 | 0x20;
        pvVar4 = rev->inserted[lVar10];
        pvVar4->next = *affected;
        *affected = pvVar4;
      }
      erase_node(tree,rev->inserted[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < rev->inserted_count);
  }
  if (0 < rev->changed_count) {
    lVar10 = 0;
    do {
      erase_node(tree,rev->changed[lVar10]);
      sVar5 = tree->csize;
      if (sVar5 != 0) {
        pvVar6 = rev->changed_data;
        pvVar4 = rev->changed[lVar10];
        sVar9 = 0;
        do {
          uVar3 = *(undefined1 *)((long)pvVar4->child + sVar9 + 0x19);
          *(undefined1 *)((long)pvVar4->child + sVar9 + 0x19) =
               *(undefined1 *)((long)pvVar6 + sVar9 + sVar5 * lVar10);
          *(undefined1 *)((long)pvVar6 + sVar9 + sVar5 * lVar10) = uVar3;
          sVar9 = sVar9 + 1;
        } while (sVar5 != sVar9);
      }
      insert_node(tree,rev->changed[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 < rev->changed_count);
  }
  lVar10._0_4_ = rev->inserted_count;
  lVar10._4_4_ = rev->erased_count;
  uVar7._0_4_ = rev->inserted_count;
  uVar7._4_4_ = rev->erased_count;
  uVar7 = lVar10 << 0x20 | uVar7 >> 0x20;
  rev->inserted_count = (int)uVar7;
  rev->erased_count = (int)(uVar7 >> 0x20);
  ppvVar8 = rev->erased;
  rev->erased = rev->inserted;
  rev->inserted = ppvVar8;
  pvVar6 = rev->erased_data;
  rev->erased_data = rev->uninserted_data;
  rev->uninserted_data = pvVar6;
  free_erased(tree,rev);
  return;
}

Assistant:

static void
toggle(bst_t *tree, bst_rev_t *rev, bst_node_t **affected)
{
	unfree_erased(tree, rev);

#ifndef DOXYGEN_IGNORE
#define ADD(node, was) \
	if (!node->inserted) { \
		node->was_in_tree = was; \
		node->inserted = 1; \
		slist_push(affected, node); \
	}
#endif
	int i;
	for (i = 0; i < rev->erased_count; i++) {
		ADD(rev->erased[i], 0);
		insert_node(tree, rev->erased[i]);
	}
	for (i = 0; i < rev->inserted_count; i++) {
		ADD(rev->inserted[i], 1);
		erase_node(tree, rev->inserted[i]);
	}
#undef ADD
	for (i = 0; i < rev->changed_count; i++) {
		//TODO: optimize
		erase_node(tree, rev->changed[i]);
		memswap(rev->changed[i]->data, rev->changed_data + i * tree->csize, tree->csize);
		insert_node(tree, rev->changed[i]);
	}

	SWAP(rev->erased_count, rev->inserted_count, int);
	SWAP(rev->erased, rev->inserted, void *);
	SWAP(rev->erased_data, rev->uninserted_data, void *);

	free_erased(tree, rev);
}